

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_ask.cxx
# Opt level: O2

int innards(char *fmt,__va_list_tag *ap,char *b0,char *b1,char *b2)

{
  _func_int **pp_Var1;
  bool bVar2;
  Fl_Fontsize FVar3;
  Fl_Window *pFVar4;
  Fl_Box *pFVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Fl_Group *g;
  undefined8 *puVar9;
  Fl_Button **ppFVar10;
  int *piVar11;
  int iVar12;
  char *pcVar13;
  Fl_Widget *this;
  int iVar14;
  int *w;
  long lVar15;
  int message_w;
  int message_h;
  int button_w [3];
  int local_448 [4];
  char buffer [1024];
  
  Fl::pushed((Fl_Widget *)0x0);
  avoidRecursion = 1;
  makeform();
  Fl_Widget::size((Fl_Widget *)message_form,0x19a,0x67);
  this = &message->super_Fl_Widget;
  if (((*fmt == '%') && (fmt[1] == 's')) && (fmt[2] == '\0')) {
    uVar8 = ap->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      puVar9 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 8;
    }
    else {
      puVar9 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar9 + 1;
    }
    pcVar13 = (char *)*puVar9;
  }
  else {
    pcVar13 = buffer;
    vsnprintf(pcVar13,0x400,fmt,ap);
    this = &message->super_Fl_Widget;
  }
  Fl_Widget::label(this,pcVar13);
  pFVar5 = message;
  (message->super_Fl_Widget).label_.font = fl_message_font_;
  FVar3 = fl_message_size_;
  if (fl_message_size_ == -1) {
    FVar3 = FL_NORMAL_SIZE;
  }
  (pFVar5->super_Fl_Widget).label_.size = FVar3;
  pp_Var1 = (button[0]->super_Fl_Widget)._vptr_Fl_Widget;
  if (b0 == (char *)0x0) {
    (*pp_Var1[6])();
    iVar12 = 0x136;
  }
  else {
    (*pp_Var1[5])();
    Fl_Widget::label(&button[0]->super_Fl_Widget,b0);
    iVar12 = 0xd2;
  }
  Fl_Widget::position(&button[1]->super_Fl_Widget,iVar12,0x46);
  pp_Var1 = (button[1]->super_Fl_Widget)._vptr_Fl_Widget;
  if (b1 == (char *)0x0) {
    (*pp_Var1[6])();
  }
  else {
    (*pp_Var1[5])();
    Fl_Widget::label(&button[1]->super_Fl_Widget,b1);
  }
  pp_Var1 = (button[2]->super_Fl_Widget)._vptr_Fl_Widget;
  if (b2 == (char *)0x0) {
    (*pp_Var1[6])();
  }
  else {
    (*pp_Var1[5])();
    Fl_Widget::label(&button[2]->super_Fl_Widget,b2);
  }
  pcVar13 = (icon->super_Fl_Widget).label_.value;
  if (pcVar13 == (char *)0x0) {
    Fl_Widget::label(&icon->super_Fl_Widget,iconlabel);
  }
  Fl_Widget::size((Fl_Widget *)message_form,0x19a,0x67);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)(message->super_Fl_Widget).label_.font,
             (ulong)(uint)(message->super_Fl_Widget).label_.size);
  message_h = 0;
  message_w = 0;
  fl_measure((message->super_Fl_Widget).label_.value,&message_w,&message_h,1);
  bVar2 = message_w < 0x14a;
  message_w = message_w + 10;
  if (bVar2) {
    message_w = 0x154;
  }
  bVar2 = message_h < 0x14;
  message_h = message_h + 10;
  if (bVar2) {
    message_h = 0x1e;
  }
  ppFVar10 = button;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)(button[0]->super_Fl_Widget).label_.font,
             (ulong)(uint)(button[0]->super_Fl_Widget).label_.size);
  button_w[2] = 0;
  button_w[0] = 0;
  button_w[1] = 0;
  local_448[0] = 0;
  local_448[1] = 0;
  local_448[2] = 0;
  iVar12 = 0x19;
  for (lVar15 = 0; lVar15 != 0xc; lVar15 = lVar15 + 4) {
    if ((((*ppFVar10)->super_Fl_Widget).flags_ & 2) == 0) {
      w = (int *)((long)button_w + lVar15);
      piVar11 = (int *)((long)local_448 + lVar15);
      fl_measure(((*ppFVar10)->super_Fl_Widget).label_.value,w,piVar11,1);
      if (lVar15 == 4) {
        button_w[1] = button_w[1] + 0x14;
      }
      *w = *w + 0x1e;
      iVar6 = *piVar11 + 10;
      *piVar11 = iVar6;
      if (iVar12 < iVar6) {
        iVar12 = iVar6;
      }
    }
    ppFVar10 = ppFVar10 + 1;
  }
  iVar6 = message_h + 0x19;
  if (((input->super_Fl_Input_).super_Fl_Widget.flags_ & 2) != 0) {
    iVar6 = message_h;
  }
  piVar11 = button_w;
  iVar7 = button_w[0] + button_w[1] + button_w[2] + -10;
  iVar14 = message_w + 0x3c;
  if (message_w + 0x3c < iVar7) {
    iVar14 = iVar7;
  }
  message_w = iVar14 + -0x3c;
  iVar14 = iVar14 + 0x14;
  iVar7 = iVar12 + iVar6 + 0x1e;
  Fl_Widget::size((Fl_Widget *)message_form,iVar14,iVar7);
  pFVar4 = message_form;
  message_form->minw = iVar14;
  pFVar4->minh = iVar7;
  pFVar4->maxw = iVar14;
  pFVar4->maxh = iVar7;
  pFVar4->dw = 0;
  pFVar4->dh = 0;
  pFVar4->aspect = 0;
  Fl_Window::size_range_(pFVar4);
  (*(message->super_Fl_Widget)._vptr_Fl_Widget[4])
            (message,0x46,10,(ulong)(uint)message_w,(ulong)(uint)message_h);
  (*(icon->super_Fl_Widget)._vptr_Fl_Widget[4])(icon,10,10,0x32,0x32);
  (icon->super_Fl_Widget).label_.size = 0x28;
  (*(input->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[4])
            (input,0x46,(ulong)(message_h + 10),(ulong)(uint)message_w,0x19);
  for (lVar15 = 0; lVar15 != 0x18; lVar15 = lVar15 + 8) {
    iVar7 = *piVar11;
    if (iVar7 != 0) {
      iVar14 = iVar14 - iVar7;
      (**(code **)(**(long **)((long)button + lVar15) + 0x20))
                (*(long **)((long)button + lVar15),iVar14,iVar6 + 0x14,iVar7 + -10,iVar12);
    }
    piVar11 = piVar11 + 1;
  }
  if ((((button[1]->super_Fl_Widget).flags_ & 2) == 0) &&
     (((input->super_Fl_Input_).super_Fl_Widget.flags_ & 2) != 0)) {
    Fl_Widget::take_focus(&button[1]->super_Fl_Widget);
  }
  if (enableHotspot != 0) {
    Fl_Window::hotspot(message_form,&button[0]->super_Fl_Widget,0);
  }
  if (b0 != (char *)0x0) {
    uVar8 = Fl_Widget::label_shortcut(b0);
    iVar12 = 0;
    if (uVar8 != 0) goto LAB_001e0f98;
  }
  iVar12 = 0xff1b;
LAB_001e0f98:
  button[0]->shortcut_ = iVar12;
  if (message_title_default != (char *)0x0 &&
      (message_form->super_Fl_Group).super_Fl_Widget.label_.value == (char *)0x0) {
    Fl_Window::label(message_form,message_title_default);
  }
  pFVar4 = Fl::grab_;
  if (Fl::grab_ != (Fl_Window *)0x0) {
    Fl::grab((Fl_Window *)0x0);
  }
  g = Fl_Group::current();
  (*(message_form->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
  Fl_Group::current(g);
  while (message_form->i != (Fl_X *)0x0) {
    Fl::wait(g);
  }
  if (pFVar4 != (Fl_Window *)0x0) {
    Fl::grab(pFVar4);
  }
  Fl_Widget::label(&icon->super_Fl_Widget,pcVar13);
  Fl_Window::label(message_form,(char *)0x0);
  avoidRecursion = 0;
  return ret_val;
}

Assistant:

static int innards(const char* fmt, va_list ap,
  const char *b0,
  const char *b1,
  const char *b2)
{
  Fl::pushed(0); // stop dragging (STR #2159)

  avoidRecursion = 1;

  makeform();
  message_form->size(410,103);
  char buffer[1024];
  if (!strcmp(fmt,"%s")) {
    message->label(va_arg(ap, const char*));
  } else {
    ::vsnprintf(buffer, 1024, fmt, ap);
    message->label(buffer);
  }

  message->labelfont(fl_message_font_);
  if (fl_message_size_ == -1)
    message->labelsize(FL_NORMAL_SIZE);
  else
    message->labelsize(fl_message_size_);
  if (b0) {button[0]->show(); button[0]->label(b0); button[1]->position(210,70);}
  else {button[0]->hide(); button[1]->position(310,70);}
  if (b1) {button[1]->show(); button[1]->label(b1);}
  else button[1]->hide();
  if (b2) {button[2]->show(); button[2]->label(b2);}
  else button[2]->hide();
  const char* prev_icon_label = icon->label();
  if (!prev_icon_label) icon->label(iconlabel);

  resizeform();

  if (button[1]->visible() && !input->visible())
    button[1]->take_focus();
  if (enableHotspot)
    message_form->hotspot(button[0]);
  if (b0 && Fl_Widget::label_shortcut(b0))
    button[0]->shortcut(0);
  else
    button[0]->shortcut(FL_Escape);

  // set default window title, if defined and a specific title is not set
  if (!message_form->label() && message_title_default)
    message_form->label(message_title_default);

  // deactivate Fl::grab(), because it is incompatible with modal windows
  Fl_Window* g = Fl::grab();
  if (g) Fl::grab(0);
  Fl_Group *current_group = Fl_Group::current(); // make sure the dialog does not interfere with any active group
  message_form->show();
  Fl_Group::current(current_group);
  while (message_form->shown()) Fl::wait();
  if (g) // regrab the previous popup menu, if there was one
    Fl::grab(g);
  icon->label(prev_icon_label);
  message_form->label(0); // reset window title

  avoidRecursion = 0;
  return ret_val;
}